

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  stbtt_uint32 sVar1;
  stbtt_uint32 sVar2;
  stbtt_uint32 sVar3;
  long lVar4;
  uint uVar5;
  uint n;
  stbtt__buf sVar6;
  stbtt__buf local_38;
  
  local_38.data = b.data;
  local_38.size = b.size;
  local_38.cursor = local_38.size >> 0x1f & local_38.size;
  sVar1 = stbtt__buf_get(&local_38,2);
  n = 0;
  if (local_38.cursor < local_38.size) {
    lVar4 = (long)local_38.cursor;
    local_38.cursor = local_38.cursor + 1;
    n = (uint)local_38.data[lVar4];
  }
  uVar5 = i * n + local_38.cursor;
  local_38.cursor = uVar5;
  if (local_38.size < (int)uVar5) {
    local_38.cursor = local_38.size;
  }
  if ((int)uVar5 < 0) {
    local_38.cursor = local_38.size;
  }
  sVar2 = stbtt__buf_get(&local_38,n);
  sVar3 = stbtt__buf_get(&local_38,n);
  sVar6 = stbtt__buf_range(&local_38,(sVar1 + 1) * n + sVar2 + 2,sVar3 - sVar2);
  return sVar6;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}